

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O1

bool slang::ast::OpInfo::isBitwise(BinaryOperator op)

{
  return op - BinaryAnd < 4;
}

Assistant:

bool OpInfo::isBitwise(BinaryOperator op) {
    switch (op) {
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            return true;
        default:
            return false;
    }
}